

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O3

void cbtDbvt::rayTest(cbtDbvtNode *root,cbtVector3 *rayFrom,cbtVector3 *rayTo,ICollide *policy)

{
  cbtDbvtNode *pcVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  cbtVector3 bounds [2];
  char tempmemory [1024];
  cbtAlignedObjectArray<const_cbtDbvtNode_*> cStack_4e8;
  cbtDbvtNode **local_4c8;
  long local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  ICollide *local_490;
  float *local_488;
  float *local_480;
  uint *local_478;
  uint *local_470;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  cbtDbvtNode *local_438 [129];
  
  if (root != (cbtDbvtNode *)0x0) {
    cStack_4e8.m_data = local_438;
    auVar23._8_4_ = 0x3f800000;
    auVar23._0_8_ = 0x3f8000003f800000;
    auVar23._12_4_ = 0x3f800000;
    iVar10 = 1;
    fVar3 = rayTo->m_floats[2] - rayFrom->m_floats[2];
    cStack_4e8.m_ownsMemory = false;
    cStack_4e8.m_size = 0x80;
    cStack_4e8.m_capacity = 0x80;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)rayTo->m_floats;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)rayFrom->m_floats;
    auVar16 = vsubps_avx(auVar17,auVar13);
    auVar17 = vmovshdup_avx(auVar16);
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar17._0_4_)),auVar16,auVar16);
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    auVar17 = vsqrtss_avx(auVar17,auVar17);
    fVar20 = 1.0 / auVar17._0_4_;
    fVar2 = fVar3 * fVar20;
    auVar22._0_4_ = auVar16._0_4_ * fVar20;
    auVar22._4_4_ = auVar16._4_4_ * fVar20;
    auVar22._8_4_ = auVar16._8_4_ * fVar20;
    auVar22._12_4_ = auVar16._12_4_ * fVar20;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT816(0) << 0x40,0);
    bVar6 = (bool)((byte)uVar5 & 1);
    auVar17 = vdivps_avx(auVar23,auVar22);
    fVar20 = (float)((uint)bVar6 * 0x5d5e0b6b + (uint)!bVar6 * (int)(1.0 / fVar2));
    uVar4 = vcmpps_avx512vl(auVar22,ZEXT816(0),0);
    auVar13 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar6 = (bool)((byte)uVar4 & 1);
    local_448._0_4_ = (uint)bVar6 * auVar13._0_4_ | (uint)!bVar6 * auVar17._0_4_;
    bVar6 = (bool)((byte)(uVar4 >> 1) & 1);
    local_448._4_4_ = (uint)bVar6 * auVar13._4_4_ | (uint)!bVar6 * auVar17._4_4_;
    bVar6 = (bool)((byte)(uVar4 >> 2) & 1);
    fStack_440 = (float)((uint)bVar6 * auVar13._8_4_ | (uint)!bVar6 * auVar17._8_4_);
    bVar6 = (bool)((byte)(uVar4 >> 3) & 1);
    fStack_43c = (float)((uint)bVar6 * auVar13._12_4_ | (uint)!bVar6 * auVar17._12_4_);
    local_458 = ZEXT416((uint)fVar20);
    auVar17 = vmovshdup_avx(_local_448);
    auVar21._0_4_ = auVar16._0_4_ * auVar22._0_4_;
    auVar21._4_4_ = auVar16._4_4_ * auVar22._4_4_;
    auVar21._8_4_ = auVar16._8_4_ * auVar22._8_4_;
    auVar21._12_4_ = auVar16._12_4_ * auVar22._12_4_;
    auVar13 = vmovshdup_avx(auVar21);
    auVar13 = vfmadd231ss_fma(auVar13,auVar22,auVar16);
    bVar6 = (float)local_448._0_4_ < 0.0;
    local_468 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar2),ZEXT416((uint)fVar3));
    local_470 = (uint *)(&local_4b8 + (ulong)(0.0 <= (float)local_448._0_4_) * 2);
    local_478 = (uint *)((long)&local_4b8 + (ulong)(auVar17._0_4_ < 0.0) * 0x10 + 4);
    local_488 = (float *)(&uStack_4b0 + (ulong)(fVar20 < 0.0) * 2);
    local_480 = (float *)(&uStack_4b0 + (ulong)(0.0 <= fVar20) * 2);
    iVar9 = 0x7e;
    local_490 = policy;
    local_438[0] = root;
    do {
      iVar11 = iVar10 + -1;
      pcVar1 = cStack_4e8.m_data[(long)iVar10 + -1];
      local_4b8 = *(undefined8 *)(pcVar1->volume).mi.m_floats;
      uStack_4b0 = *(undefined8 *)((pcVar1->volume).mi.m_floats + 2);
      local_4a8 = *(undefined8 *)(pcVar1->volume).mx.m_floats;
      uStack_4a0 = *(undefined8 *)((pcVar1->volume).mx.m_floats + 2);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)rayFrom->m_floats;
      auVar13 = vinsertps_avx(ZEXT416(*(uint *)(&local_4b8 + (ulong)bVar6 * 2)),
                              ZEXT416(*(uint *)((long)&local_4b8 +
                                               (ulong)(0.0 <= auVar17._0_4_) * 0x10 + 4)),0x10);
      auVar13 = vsubps_avx(auVar13,auVar18);
      auVar16._0_4_ = (float)local_448._0_4_ * auVar13._0_4_;
      auVar16._4_4_ = (float)local_448._4_4_ * auVar13._4_4_;
      auVar16._8_4_ = fStack_440 * auVar13._8_4_;
      auVar16._12_4_ = fStack_43c * auVar13._12_4_;
      auVar13 = vmovshdup_avx(auVar16);
      if (auVar16._0_4_ <= auVar13._0_4_) {
        auVar21 = vinsertps_avx(ZEXT416(*local_470),ZEXT416(*local_478),0x10);
        auVar21 = vsubps_avx(auVar21,auVar18);
        auVar19._0_4_ = (float)local_448._0_4_ * auVar21._0_4_;
        auVar19._4_4_ = (float)local_448._4_4_ * auVar21._4_4_;
        auVar19._8_4_ = fStack_440 * auVar21._8_4_;
        auVar19._12_4_ = fStack_43c * auVar21._12_4_;
        auVar21 = vmovshdup_avx(auVar19);
        if (auVar21._0_4_ <= auVar19._0_4_) {
          auVar22 = vshufps_avx(auVar19,auVar19,0xe1);
          uVar4 = vcmpps_avx512vl(auVar16,auVar22,1);
          auVar14._4_12_ = auVar16._4_12_;
          auVar14._0_4_ =
               (float)((uint)((byte)uVar4 & 1) * (int)auVar21._0_4_ +
                      (uint)!(bool)((byte)uVar4 & 1) * (int)auVar16._0_4_);
          fVar2 = local_458._0_4_ * (*local_480 - rayFrom->m_floats[2]);
          if (auVar14._0_4_ <= fVar2) {
            bVar7 = (byte)(uVar4 >> 1);
            auVar15._4_12_ = auVar19._4_12_;
            auVar15._0_4_ =
                 (float)((uint)(bVar7 & 1) * (int)auVar13._0_4_ +
                        (uint)!(bool)(bVar7 & 1) * (int)auVar19._0_4_);
            fVar3 = local_458._0_4_ * (*local_488 - rayFrom->m_floats[2]);
            if (((fVar3 <= auVar15._0_4_) &&
                (auVar13 = vmaxss_avx(ZEXT416((uint)fVar3),auVar14), auVar13._0_4_ < local_468._0_4_
                )) && (auVar13 = vminss_avx(ZEXT416((uint)fVar2),auVar15), 0.0 < auVar13._0_4_)) {
              if ((pcVar1->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                (*local_490->_vptr_ICollide[3])(local_490,pcVar1);
              }
              else {
                if (iVar9 < iVar11) {
                  lVar12 = (long)cStack_4e8.m_size;
                  lVar8 = lVar12 * 2;
                  if (cStack_4e8.m_size < (int)lVar8) {
                    if (cStack_4e8.m_capacity < (int)lVar8) {
                      local_4c0 = lVar8;
                      if (cStack_4e8.m_size == 0) {
                        local_4c8 = (cbtDbvtNode **)0x0;
                      }
                      else {
                        local_4c8 = (cbtDbvtNode **)cbtAlignedAllocInternal(lVar12 << 4,0x10);
                        if (0 < (long)cStack_4e8.m_size) {
                          lVar8 = 0;
                          do {
                            local_4c8[lVar8] = cStack_4e8.m_data[lVar8];
                            lVar8 = lVar8 + 1;
                          } while (cStack_4e8.m_size != lVar8);
                        }
                      }
                      if ((cStack_4e8.m_data != (cbtDbvtNode **)0x0) &&
                         (cStack_4e8.m_ownsMemory == true)) {
                        cbtAlignedFreeInternal(cStack_4e8.m_data);
                      }
                      cStack_4e8.m_ownsMemory = true;
                      cStack_4e8.m_data = local_4c8;
                      cStack_4e8._4_8_ = local_4c0 << 0x20;
                      lVar8 = local_4c0;
                    }
                    do {
                      cStack_4e8.m_data[lVar12] = (cbtDbvtNode *)0x0;
                      lVar12 = lVar12 + 1;
                    } while ((int)lVar8 != lVar12);
                  }
                  iVar9 = (int)lVar8 + -2;
                  cStack_4e8.m_size = (int)lVar8;
                }
                cStack_4e8.m_data[(long)iVar10 + -1] = (pcVar1->field_2).childs[0];
                cStack_4e8.m_data[iVar10] = (pcVar1->field_2).childs[1];
                iVar11 = iVar10 + 1;
              }
            }
          }
        }
      }
      iVar10 = iVar11;
    } while (iVar10 != 0);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray(&cStack_4e8);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::rayTest(const cbtDbvtNode* root,
							const cbtVector3& rayFrom,
							const cbtVector3& rayTo,
							DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
	if (root)
	{
		cbtVector3 rayDir = (rayTo - rayFrom);
		rayDir.normalize();

		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		cbtVector3 rayDirectionInverse;
		rayDirectionInverse[0] = rayDir[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[0];
		rayDirectionInverse[1] = rayDir[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[1];
		rayDirectionInverse[2] = rayDir[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[2];
		unsigned int signs[3] = {rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};

		cbtScalar lambda_max = rayDir.dot(rayTo - rayFrom);

		cbtVector3 resultNormal;

		cbtAlignedObjectArray<const cbtDbvtNode*> stack;

		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 2;

		char tempmemory[DOUBLE_STACKSIZE * sizeof(const cbtDbvtNode*)];
#ifndef BT_DISABLE_STACK_TEMP_MEMORY
		stack.initializeFromBuffer(tempmemory, DOUBLE_STACKSIZE, DOUBLE_STACKSIZE);
#else   //BT_DISABLE_STACK_TEMP_MEMORY
		stack.resize(DOUBLE_STACKSIZE);
#endif  //BT_DISABLE_STACK_TEMP_MEMORY
		stack[0] = root;
		cbtVector3 bounds[2];
		do
		{
			const cbtDbvtNode* node = stack[--depth];

			bounds[0] = node->volume.Mins();
			bounds[1] = node->volume.Maxs();

			cbtScalar tmin = 1.f, lambda_min = 0.f;
			unsigned int result1 = cbtRayAabb2(rayFrom, rayDirectionInverse, signs, bounds, tmin, lambda_min, lambda_max);

#ifdef COMPARE_BTRAY_AABB2
			cbtScalar param = 1.f;
			bool result2 = cbtRayAabb(rayFrom, rayTo, node->volume.Mins(), node->volume.Maxs(), param, resultNormal);
			cbtAssert(result1 == result2);
#endif  //TEST_BTRAY_AABB2

			if (result1)
			{
				if (node->isinternal())
				{
					if (depth > treshold)
					{
						stack.resize(stack.size() * 2);
						treshold = stack.size() - 2;
					}
					stack[depth++] = node->childs[0];
					stack[depth++] = node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while (depth);
	}
}